

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O1

void __thiscall sptk::SpectrumToSpectrum::~SpectrumToSpectrum(SpectrumToSpectrum *this)

{
  ~SpectrumToSpectrum(this);
  operator_delete(this);
  return;
}

Assistant:

SpectrumToSpectrum::~SpectrumToSpectrum() {
  for (std::vector<SpectrumToSpectrum::OperationInterface*>::iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    delete (*itr);
  }
}